

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

TreeOrError *
slang::syntax::SyntaxTree::fromFiles
          (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
           paths,SourceManager *sourceManager,Bag *options)

{
  bool bVar1;
  size_type sVar2;
  reference pbVar3;
  SmallVector<slang::SourceBuffer,_4UL> *in_RCX;
  SourceManager *in_RDI;
  BufferOrError buffer;
  basic_string_view<char,_std::char_traits<char>_> path;
  iterator __end2;
  iterator __begin2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range2;
  SmallVector<slang::SourceBuffer,_4UL> buffers;
  undefined1 in_stack_000007ff;
  Bag *in_stack_00000800;
  SourceManager *in_stack_00000808;
  span<const_slang::SourceBuffer,_18446744073709551615UL> in_stack_00000810;
  MacroList in_stack_00000830;
  SourceBuffer *in_stack_fffffffffffffde8;
  shared_ptr<slang::syntax::SyntaxTree> *value;
  SmallVectorBase<slang::SourceBuffer> *in_stack_fffffffffffffdf0;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffdf8;
  span<const_slang::SourceBuffer,_18446744073709551615UL> *in_stack_fffffffffffffe00;
  error_type *in_stack_fffffffffffffe10;
  SmallVector<slang::SourceBuffer,_4UL> *library;
  SourceManager *this;
  undefined7 local_1d0;
  format in_stack_fffffffffffffe37;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe38;
  path *in_stack_fffffffffffffe40;
  pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_> local_198 [5];
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_d8;
  undefined1 *local_d0;
  SmallVector<slang::SourceBuffer,_4UL> local_c0;
  SmallVector<slang::SourceBuffer,_4UL> *local_20;
  undefined1 local_18 [24];
  
  this = in_RDI;
  local_20 = in_RCX;
  sVar2 = std::
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          ::size((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                  *)0x2d2d19);
  SmallVector<slang::SourceBuffer,_4UL>::SmallVector(&local_c0,sVar2);
  local_d0 = local_18;
  local_d8._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
       begin((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)in_stack_fffffffffffffde8);
  local_e0 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             ::end(in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffde8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
             ::operator*(&local_d8);
    local_f8._M_len = pbVar3->_M_len;
    local_f8._M_str = pbVar3->_M_str;
    library = local_20;
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37);
    SourceManager::readSource
              (this,(path *)in_RDI,(SourceLibrary *)library,(uint64_t)in_stack_fffffffffffffe10);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffdf0);
    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                      ((expected<slang::SourceBuffer,_std::error_code> *)0x2d2e05);
    if (bVar1) {
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                ((expected<slang::SourceBuffer,_std::error_code> *)0x2d2ee7);
      SmallVectorBase<slang::SourceBuffer>::push_back
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    }
    else {
      in_stack_fffffffffffffe10 =
           nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::error
                     ((expected<slang::SourceBuffer,_std::error_code> *)0x2d2e1a);
      std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<std::error_code_&,_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
                (local_198,in_stack_fffffffffffffe10,&local_f8);
      nonstd::expected_lite::
      make_unexpected<std::pair<std::error_code,std::basic_string_view<char,std::char_traits<char>>>>
                ((pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 in_stack_fffffffffffffdf0);
      nonstd::expected_lite::
      expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::
      expected<std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>,_0>
                ((expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffe00,
                 (unexpected_type<std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffdf8);
    }
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffdf0);
    if (!bVar1) goto LAB_002d2fbe;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++(&local_d8);
  }
  std::span<const_slang::SourceBuffer,_18446744073709551615UL>::
  span<slang::SmallVector<slang::SourceBuffer,_4UL>_&>(in_stack_fffffffffffffe00,local_20);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x2d2f6f);
  value = (shared_ptr<slang::syntax::SyntaxTree> *)CONCAT17(in_stack_fffffffffffffe37,local_1d0);
  create(in_stack_00000808,in_stack_00000810,in_stack_00000800,in_stack_00000830,
         (bool)in_stack_000007ff);
  nonstd::expected_lite::
  expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::expected<std::shared_ptr<slang::syntax::SyntaxTree>,_0>
            ((expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffe38,value);
  std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
            ((shared_ptr<slang::syntax::SyntaxTree> *)0x2d2fb6);
LAB_002d2fbe:
  SmallVector<slang::SourceBuffer,_4UL>::~SmallVector
            ((SmallVector<slang::SourceBuffer,_4UL> *)0x2d2fcb);
  return (TreeOrError *)this;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths,
                                              SourceManager& sourceManager, const Bag& options) {
    SmallVector<SourceBuffer, 4> buffers(paths.size(), UninitializedTag());
    for (auto path : paths) {
        auto buffer = sourceManager.readSource(path, /* library */ nullptr);
        if (!buffer)
            return nonstd::make_unexpected(std::pair{buffer.error(), path});

        buffers.push_back(*buffer);
    }

    return create(sourceManager, buffers, options, {}, false);
}